

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inline.cpp
# Opt level: O3

bool __thiscall
Inline::SplitConstructorCallCommon
          (Inline *this,Instr *newObjInstr,Opnd *lastArgOpnd,OpCode newObjOpCode,bool isInlined,
          bool isFixed,Instr **createObjInstrOut,Instr **callCtorInstrOut)

{
  undefined1 *puVar1;
  IRKind IVar2;
  ushort profiledCallSiteId;
  Func *pFVar3;
  Func *func;
  code *pcVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  byte bVar8;
  ValueType valueType;
  undefined4 *puVar9;
  JITTimeConstructorCache *this_00;
  FixedFieldInfo *this_01;
  intptr_t iVar10;
  intptr_t iVar11;
  ProfiledInstr *this_02;
  AddrOpnd *pAVar12;
  StackSym *sym;
  SymOpnd *dstOpnd;
  Instr *pIVar13;
  Instr *instr;
  Instr *pIVar14;
  Opnd *pOVar15;
  OpCode OVar16;
  bool bVar17;
  AddrOpnd *local_40;
  
  if (newObjInstr == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar9 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                       ,0x1123,"(newObjInstr)","newObjInstr");
    if (!bVar5) goto LAB_005560ee;
    *puVar9 = 0;
  }
  if (newObjInstr->m_src1 == (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar9 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                       ,0x1124,"(newObjInstr->GetSrc1())","newObjInstr->GetSrc1()");
    if (!bVar5) goto LAB_005560ee;
    *puVar9 = 0;
  }
  if (lastArgOpnd == (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar9 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                       ,0x1125,"(lastArgOpnd)","lastArgOpnd");
    if (!bVar5) goto LAB_005560ee;
    *puVar9 = 0;
  }
  if (!isInlined && !isFixed) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar9 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                       ,0x1126,"(isInlined || isFixed)","isInlined || isFixed");
    if (!bVar5) goto LAB_005560ee;
    *puVar9 = 0;
  }
  pFVar3 = newObjInstr->m_func;
  IVar2 = newObjInstr->m_kind;
  bVar5 = IVar2 == InstrKindProfiled;
  if (bVar5) {
    profiledCallSiteId = *(ushort *)&newObjInstr[1]._vptr_Instr;
    this_00 = Func::GetConstructorCache(pFVar3,profiledCallSiteId);
    bVar17 = this_00 == (JITTimeConstructorCache *)0x0;
    if (bVar17) {
      bVar6 = false;
    }
    else {
      bVar6 = JITTimeConstructorCache::CtorHasNoExplicitReturnValue(this_00);
      bVar7 = JITTimeConstructorCache::SkipNewScObject(this_00);
      if (bVar7) {
        if (isInlined) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar9 = 1;
          bVar17 = Js::Throw::ReportAssert
                             ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                              ,0x1149,"(!isInlined || !skipNewScObj)","!isInlined || !skipNewScObj")
          ;
          if (!bVar17) goto LAB_005560ee;
          *puVar9 = 0;
        }
        if (!isFixed) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar9 = 1;
          bVar17 = Js::Throw::ReportAssert
                             ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                              ,0x114a,"(isFixed || !skipNewScObj)","isFixed || !skipNewScObj");
          if (!bVar17) goto LAB_005560ee;
          *puVar9 = 0;
        }
        this_01 = IR::Instr::GetFixedFunction(newObjInstr);
        iVar10 = FixedFieldInfo::GetFuncInfoAddr(this_01);
        iVar11 = ThreadContextInfo::GetJavascriptObjectNewInstanceAddr
                           (this->topFunc->m_threadContextInfo);
        if ((iVar10 == iVar11) ||
           (iVar11 = ThreadContextInfo::GetJavascriptArrayNewInstanceAddr
                               (this->topFunc->m_threadContextInfo), iVar10 == iVar11)) {
          local_40 = (AddrOpnd *)0x0;
          bVar17 = IR::Instr::HasEmptyArgOutChain(newObjInstr,(Instr **)0x0);
          if (bVar17) goto LAB_005560d4;
        }
        else {
          local_40 = (AddrOpnd *)0x0;
        }
        goto LAB_00555b93;
      }
    }
    local_40 = (AddrOpnd *)IR::RegOpnd::New(TyVar,pFVar3);
    this_02 = IR::ProfiledInstr::New(newObjOpCode,(Opnd *)local_40,newObjInstr->m_src1,pFVar3);
    if ((this_02->super_Instr).m_kind != InstrKindProfiled) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar9 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0xd5,"(this->IsProfiledInstr())","Bad call to AsProfiledInstr()");
      if (!bVar5) goto LAB_005560ee;
      *puVar9 = 0;
    }
    *(uint *)&this_02->u = (uint)profiledCallSiteId;
LAB_00555b48:
    IR::Instr::SetByteCodeOffset(&this_02->super_Instr,newObjInstr);
    IR::Opnd::SetIsJITOptimizedReg((this_02->super_Instr).m_src1,true);
    puVar1 = &(this_02->super_Instr).field_0x37;
    *puVar1 = *puVar1 | 2;
    IR::Instr::InsertBefore(newObjInstr,&this_02->super_Instr);
    bVar5 = false;
    valueType = ValueType::GetObject(UninitializedObject);
    IR::Opnd::SetValueType(&local_40->super_Opnd,valueType);
    pAVar12 = local_40;
  }
  else {
    local_40 = (AddrOpnd *)IR::RegOpnd::New(TyVar,pFVar3);
    this_02 = (ProfiledInstr *)
              IR::Instr::New(newObjOpCode,(Opnd *)local_40,newObjInstr->m_src1,pFVar3);
    bVar6 = false;
    if (this_02 != (ProfiledInstr *)0x0) {
      bVar17 = true;
      goto LAB_00555b48;
    }
LAB_00555b93:
    bVar17 = IVar2 != InstrKindProfiled;
    pAVar12 = IR::AddrOpnd::NewNull(newObjInstr->m_func);
    this_02 = (ProfiledInstr *)0x0;
  }
  sym = SymTable::GetArgSlotSym(pFVar3->m_symTable,1);
  dstOpnd = IR::SymOpnd::New(&sym->super_Sym,TyVar,pFVar3);
  pIVar13 = IR::Instr::New(ArgOut_A,&dstOpnd->super_Opnd,&pAVar12->super_Opnd,lastArgOpnd,pFVar3);
  IR::Instr::SetByteCodeOffset(pIVar13,newObjInstr);
  IR::Opnd::SetIsJITOptimizedReg(pIVar13->m_dst,true);
  IR::Opnd::SetIsJITOptimizedReg(pIVar13->m_src2,true);
  IR::Instr::InsertBefore(newObjInstr,pIVar13);
  OVar16 = CallI;
  if (isFixed) {
    OVar16 = CallIFixed;
  }
  newObjInstr->m_opcode = OVar16;
  newObjInstr->field_0x37 = newObjInstr->field_0x37 | 0x20;
  if ((newObjInstr->m_src2 != (Opnd *)0x0) &&
     (IR::Instr::FreeSrc2(newObjInstr), newObjInstr->m_src2 != (Opnd *)0x0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar9 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x18b,"(this->m_src2 == __null)","Trying to overwrite existing src.");
    if (!bVar7) goto LAB_005560ee;
    *puVar9 = 0;
  }
  func = newObjInstr->m_func;
  if ((dstOpnd->super_Opnd).isDeleted == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar9 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x14,"(!isDeleted)","Using deleted operand");
    if (!bVar7) goto LAB_005560ee;
    *puVar9 = 0;
  }
  bVar8 = (dstOpnd->super_Opnd).field_0xb;
  if ((bVar8 & 2) != 0) {
    dstOpnd = (SymOpnd *)IR::Opnd::Copy(&dstOpnd->super_Opnd,func);
    bVar8 = (dstOpnd->super_Opnd).field_0xb;
  }
  (dstOpnd->super_Opnd).field_0xb = bVar8 | 2;
  newObjInstr->m_src2 = &dstOpnd->super_Opnd;
  pIVar13 = newObjInstr->m_next;
  if (pIVar13 == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar9 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                       ,0x1188,"(insertBeforeInstr)","insertBeforeInstr");
    if (!bVar7) goto LAB_005560ee;
    *puVar9 = 0;
  }
  instr = IR::Instr::GetNextRealInstrOrLabel(newObjInstr);
  if (bVar6 == false) {
    if (!bVar5) {
      pAVar12 = (AddrOpnd *)newObjInstr->m_dst;
      if (local_40 == pAVar12) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar9 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                           ,0x1198,"(createObjDst != newObjInstr->GetDst())",
                           "createObjDst != newObjInstr->GetDst()");
        if (!bVar5) goto LAB_005560ee;
        *puVar9 = 0;
        pAVar12 = (AddrOpnd *)newObjInstr->m_dst;
      }
      IR::Opnd::SetValueType(&pAVar12->super_Opnd,(ValueType)0x9);
      pIVar14 = IR::Instr::New(GetNewScObject,newObjInstr->m_dst,newObjInstr->m_dst,
                               &local_40->super_Opnd,pFVar3);
      goto LAB_00555e54;
    }
  }
  else {
    pIVar14 = IR::Instr::New(Ld_A,newObjInstr->m_dst,&local_40->super_Opnd,pFVar3);
LAB_00555e54:
    IR::Instr::SetByteCodeOffset(pIVar14,instr);
    IR::Opnd::SetIsJITOptimizedReg(pIVar14->m_dst,true);
    IR::Opnd::SetIsJITOptimizedReg(pIVar14->m_src1,true);
    IR::Instr::InsertBefore(pIVar13,pIVar14);
  }
  if (bVar17) {
    pIVar14 = IR::Instr::New(UpdateNewScObjectCache,pFVar3);
    pOVar15 = newObjInstr->m_src1;
    if (pIVar14->m_src1 != (Opnd *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar9 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0x16c,"(this->m_src1 == __null)","Trying to overwrite existing src.");
      if (!bVar5) goto LAB_005560ee;
      *puVar9 = 0;
    }
    pFVar3 = pIVar14->m_func;
    if (pOVar15->isDeleted == true) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar9 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x14,"(!isDeleted)","Using deleted operand");
      if (!bVar5) goto LAB_005560ee;
      *puVar9 = 0;
    }
    bVar8 = pOVar15->field_0xb;
    if ((bVar8 & 2) != 0) {
      pOVar15 = IR::Opnd::Copy(pOVar15,pFVar3);
      bVar8 = pOVar15->field_0xb;
    }
    pOVar15->field_0xb = bVar8 | 2;
    pIVar14->m_src1 = pOVar15;
    pOVar15 = newObjInstr->m_dst;
    if (pIVar14->m_src2 != (Opnd *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar9 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0x18b,"(this->m_src2 == __null)","Trying to overwrite existing src.");
      if (!bVar5) goto LAB_005560ee;
      *puVar9 = 0;
    }
    pFVar3 = pIVar14->m_func;
    if (pOVar15->isDeleted == true) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar9 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x14,"(!isDeleted)","Using deleted operand");
      if (!bVar5) {
LAB_005560ee:
        pcVar4 = (code *)invalidInstructionException();
        (*pcVar4)();
      }
      *puVar9 = 0;
    }
    bVar8 = pOVar15->field_0xb;
    if ((bVar8 & 2) != 0) {
      pOVar15 = IR::Opnd::Copy(pOVar15,pFVar3);
      bVar8 = pOVar15->field_0xb;
    }
    pOVar15->field_0xb = bVar8 | 2;
    pIVar14->m_src2 = pOVar15;
    IR::Instr::SetByteCodeOffset(pIVar14,instr);
    IR::Opnd::SetIsJITOptimizedReg(pIVar14->m_src1,true);
    IR::Opnd::SetIsJITOptimizedReg(pIVar14->m_src2,true);
    IR::Instr::InsertBefore(pIVar13,pIVar14);
  }
  if (createObjInstrOut != (Instr **)0x0) {
    *createObjInstrOut = &this_02->super_Instr;
  }
  local_40 = (AddrOpnd *)&DAT_00000001;
  if (callCtorInstrOut != (Instr **)0x0) {
    *callCtorInstrOut = newObjInstr;
  }
LAB_005560d4:
  return SUB81(local_40,0);
}

Assistant:

bool
Inline::SplitConstructorCallCommon(
    IR::Instr *const newObjInstr,
    IR::Opnd *const lastArgOpnd,
    const Js::OpCode newObjOpCode,
    const bool isInlined,
    const bool isFixed,
    IR::Instr** createObjInstrOut,
    IR::Instr** callCtorInstrOut) const
{
    Assert(newObjInstr);
    Assert(newObjInstr->GetSrc1());
    Assert(lastArgOpnd);
    Assert(isInlined || isFixed);

    const auto callerFunc = newObjInstr->m_func;

    // Call the NoCtor version of NewScObject

    // Use a temporary register for the newly allocated object (before the call to ctor) - even if we know we'll return this
    // object from the whole operation.  That's so that we don't trash the bytecode register if we need to bail out at
    // object allocation (bytecode instruction has the form [Profiled]NewScObject R6 = R6).
    IR::RegOpnd* createObjDst = nullptr;
    IR::Instr* createObjInstr = nullptr;
    const JITTimeConstructorCache* constructorCache;
    bool returnCreatedObject = false;
    bool skipNewScObj = false;

    if (newObjInstr->IsProfiledInstr())
    {
        Js::ProfileId profiledCallSiteId = static_cast<Js::ProfileId>(newObjInstr->AsProfiledInstr()->u.profileId);
        constructorCache = newObjInstr->m_func->GetConstructorCache(profiledCallSiteId);
        returnCreatedObject = constructorCache != nullptr && constructorCache->CtorHasNoExplicitReturnValue();
        skipNewScObj = constructorCache != nullptr && constructorCache->SkipNewScObject();
        if (!skipNewScObj)
        {
            createObjDst = IR::RegOpnd::New(TyVar, callerFunc);
            createObjInstr = IR::ProfiledInstr::New(newObjOpCode, createObjDst, newObjInstr->GetSrc1(), callerFunc);
            createObjInstr->AsProfiledInstr()->u.profileId = profiledCallSiteId;
        }
    }
    else
    {
        constructorCache = nullptr;
        createObjDst = IR::RegOpnd::New(TyVar, callerFunc);
        createObjInstr = IR::Instr::New(newObjOpCode, createObjDst, newObjInstr->GetSrc1(), callerFunc);
    }

    Assert(!isInlined || !skipNewScObj);
    Assert(isFixed || !skipNewScObj);

    // For new Object() and new Array() we have special fast helpers.  We'll let the lowerer convert this instruction directly
    // into a call to one of these helpers.
    if (skipNewScObj)
    {
        FixedFieldInfo* ctor = newObjInstr->GetFixedFunction();
        intptr_t ctorInfo = ctor->GetFuncInfoAddr();
        if ((ctorInfo == topFunc->GetThreadContextInfo()->GetJavascriptObjectNewInstanceAddr() ||
            ctorInfo == topFunc->GetThreadContextInfo()->GetJavascriptArrayNewInstanceAddr()) &&
            newObjInstr->HasEmptyArgOutChain())
        {
            return false;
        }
    }

    IR::Opnd* thisPtrOpnd;
    if (createObjInstr != nullptr)
    {
        createObjInstr->SetByteCodeOffset(newObjInstr);
        createObjInstr->GetSrc1()->SetIsJITOptimizedReg(true);
        // We're splitting a single byte code, so the interpreter has to resume from the beginning if we bail out.
        createObjInstr->forcePreOpBailOutIfNeeded = true;
        newObjInstr->InsertBefore(createObjInstr);

        createObjDst->SetValueType(ValueType::GetObject(ObjectType::UninitializedObject));
        thisPtrOpnd = createObjDst;
    }
    else
    {
        thisPtrOpnd = IR::AddrOpnd::NewNull(newObjInstr->m_func);
    }

    // Pass the new object to the constructor function with an ArgOut
    const auto thisArgOpnd = IR::SymOpnd::New(callerFunc->m_symTable->GetArgSlotSym(1), TyVar, callerFunc);
    auto instr = IR::Instr::New(Js::OpCode::ArgOut_A, thisArgOpnd, thisPtrOpnd, lastArgOpnd, callerFunc);
    instr->SetByteCodeOffset(newObjInstr);
    instr->GetDst()->SetIsJITOptimizedReg(true);
    instr->GetSrc2()->SetIsJITOptimizedReg(true);
    newObjInstr->InsertBefore(instr);

    // Call the constructor using CallI with isCtorCall set.  If we inline the constructor, and the inlined constructor
    // bails out, the interpreter would be entered with CallFlags_Value as well. If the interpreter starts using the
    // call flags, the proper call flags will need to be specified here by using a different op code specific to constructors.
    if (isFixed)
    {
        newObjInstr->m_opcode = Js::OpCode::CallIFixed;
    }
    else
    {
        newObjInstr->m_opcode = Js::OpCode::CallI;
    }

    newObjInstr->isCtorCall = true;

    if(newObjInstr->GetSrc2())
    {
        newObjInstr->FreeSrc2();
    }
    newObjInstr->SetSrc2(thisArgOpnd);

    const auto insertBeforeInstr = newObjInstr->m_next;
    Assert(insertBeforeInstr);
    const auto nextByteCodeOffsetInstr = newObjInstr->GetNextRealInstrOrLabel();

    // Determine which object to use as the final result of NewScObject, the object passed into the constructor as 'this', or
    // the object returned by the constructor.  We only need this if we don't have a hard-coded constructor cache, or if the
    // constructor returns something explicitly.  Otherwise, we simply return the object we allocated and passed to the constructor.
    if (returnCreatedObject)
    {
        instr = IR::Instr::New(Js::OpCode::Ld_A, newObjInstr->GetDst(), createObjDst, callerFunc);
        instr->SetByteCodeOffset(nextByteCodeOffsetInstr);
        instr->GetDst()->SetIsJITOptimizedReg(true);
        instr->GetSrc1()->SetIsJITOptimizedReg(true);
        insertBeforeInstr->InsertBefore(instr);
    }
    else if (!skipNewScObj)
    {
        Assert(createObjDst != newObjInstr->GetDst());

        // Since we're not returning the default new object, the constructor must be returning something explicitly.  We don't
        // know at this point whether it's an object or not.  If the constructor is later inlined, the value type will be determined
        // from the flow in glob opt.  Otherwise, we'll need to emit an object check.
        newObjInstr->GetDst()->SetValueType(ValueType::Uninitialized);

        instr = IR::Instr::New(Js::OpCode::GetNewScObject, newObjInstr->GetDst(), newObjInstr->GetDst(), createObjDst, callerFunc);
        instr->SetByteCodeOffset(nextByteCodeOffsetInstr);
        instr->GetDst()->SetIsJITOptimizedReg(true);
        instr->GetSrc1()->SetIsJITOptimizedReg(true);
        insertBeforeInstr->InsertBefore(instr);
    }

    // Update the NewScObject cache, but only if we don't have a hard-coded constructor cache.  We only clone caches that
    // don't require update, and once updated a cache never requires an update again.
    if (constructorCache == nullptr)
    {
        instr = IR::Instr::New(Js::OpCode::UpdateNewScObjectCache, callerFunc);
        instr->SetSrc1(newObjInstr->GetSrc1()); // constructor function
        instr->SetSrc2(newObjInstr->GetDst());  // the new object
        instr->SetByteCodeOffset(nextByteCodeOffsetInstr);
        instr->GetSrc1()->SetIsJITOptimizedReg(true);
        instr->GetSrc2()->SetIsJITOptimizedReg(true);
        insertBeforeInstr->InsertBefore(instr);
    }

    if (createObjInstrOut != nullptr)
    {
        *createObjInstrOut = createObjInstr;
    }

    if (callCtorInstrOut != nullptr)
    {
        *callCtorInstrOut = newObjInstr;
    }

    return true;
}